

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::WrappingVisitor::internalVisit(WrappingVisitor *this,StuntDouble *sd)

{
  Snapshot *this_00;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  iterator i;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d newPos;
  allocator<char> local_a9;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined8 local_90;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  undefined1 local_48 [24];
  
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._M_ptr = (element_type *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._M_ptr = (element_type *)0x0;
  local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"ATOMDATA",&local_a9);
  StuntDouble::getPropertyByName((StuntDouble *)local_48,(string *)sd);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_78,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)local_68);
  if (local_78._M_ptr != (element_type *)0x0) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_68);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_88,local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
    if (local_88._M_ptr != (element_type *)0x0) {
      this_00 = this->info->sman_->currentSnapshot_;
      AtomData::beginAtomInfo((AtomData *)local_68,(iterator *)local_88._M_ptr);
      std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a8,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
      while (local_a8._M_ptr != (element_type *)0x0) {
        operator-((Vector<double,_3U> *)local_48,&((local_a8._M_ptr)->pos).super_Vector<double,_3U>,
                  &(this->origin_).super_Vector<double,_3U>);
        Vector<double,_3U>::Vector((Vector<double,_3U> *)local_68,(Vector<double,_3U> *)local_48);
        Snapshot::wrapVector(this_00,(Vector3d *)local_68);
        Vector<double,_3U>::operator=
                  (&((local_a8._M_ptr)->pos).super_Vector<double,_3U>,(Vector<double,_3U> *)local_68
                  );
        AtomData::nextAtomInfo((AtomData *)local_68,(iterator *)local_88._M_ptr);
        std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_a8,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_68)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return;
}

Assistant:

void WrappingVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) return;
    } else
      return;

    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();

    for (atomInfo = atomData->beginAtomInfo(i); atomInfo;
         atomInfo = atomData->nextAtomInfo(i)) {
      Vector3d newPos = atomInfo->pos - origin_;
      currSnapshot->wrapVector(newPos);
      atomInfo->pos = newPos;
    }
  }